

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<5,_3,_3>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  long lVar1;
  Vector<float,_3> *in_RCX;
  Type in1;
  Type in0;
  Vector<float,_3> res;
  Vector<float,_3> res_1;
  Vector<float,_3> local_70;
  undefined8 local_60;
  float local_58;
  Vec4 *local_50;
  undefined8 local_48;
  float local_40 [5];
  Matrix<float,_3,_3> local_2c;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    local_60 = *(undefined8 *)(evalCtx->coords).m_data;
    local_58 = (evalCtx->coords).m_data[2];
  }
  else {
    local_60 = 0x3dcccccd3f8ccccd;
    local_58 = 0.5;
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    local_70.m_data._0_8_ = *(undefined8 *)(evalCtx->coords).m_data;
    local_70.m_data[2] = (evalCtx->coords).m_data[2];
  }
  else {
    local_70.m_data[0] = -0.2;
    local_70.m_data[1] = 0.5;
    local_70.m_data[2] = 0.8;
  }
  outerProduct<float,3,3>(&local_2c,(MatrixCaseUtils *)&local_60,&local_70,in_RCX);
  local_48 = (ulong)local_48._4_4_ << 0x20;
  local_50 = (Vec4 *)0x0;
  lVar1 = 0;
  do {
    *(float *)((long)&local_50 + lVar1 * 4) =
         local_2c.m_data.m_data[0].m_data[lVar1] + local_2c.m_data.m_data[1].m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  local_40[4] = 0.0;
  local_40[2] = 0.0;
  local_40[3] = 0.0;
  lVar1 = 0;
  do {
    local_40[lVar1 + 2] =
         *(float *)((long)&local_50 + lVar1 * 4) + local_2c.m_data.m_data[2].m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  local_50 = &evalCtx->color;
  local_48 = 0x100000000;
  local_40[0] = 2.8026e-45;
  lVar1 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_50 + lVar1 * 4)] = local_40[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(outerProduct(in0, in1));
	}